

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::CIE,_const_pstack::Dwarf::CFI_*> *dcie)

{
  JObject *pJVar1;
  ostream *poVar2;
  DumpCFAInsns local_68;
  char local_51;
  uint local_50;
  char local_49;
  unsigned_long local_48;
  char local_40 [19];
  char local_2d;
  uint local_2c;
  JObject local_28;
  JSON<pstack::Dwarf::CIE,_const_pstack::Dwarf::CFI_*> *local_18;
  JSON<pstack::Dwarf::CIE,_const_pstack::Dwarf::CFI_*> *dcie_local;
  ostream *os_local;
  
  local_18 = dcie;
  dcie_local = (JSON<pstack::Dwarf::CIE,_const_pstack::Dwarf::CFI_*> *)os;
  JObject::JObject(&local_28,os);
  local_2c = (uint)local_18->object->version;
  local_2d = '\0';
  pJVar1 = JObject::field<char[8],int,char>
                     (&local_28,(char (*) [8])0x2a871f,(int *)&local_2c,&local_2d);
  local_40[3] = 0;
  pJVar1 = JObject::field<char[13],std::__cxx11::string,char>
                     (pJVar1,(char (*) [13])"augmentation",&local_18->object->augmentation,
                      local_40 + 3);
  local_40[2] = 0;
  pJVar1 = JObject::field<char[10],unsigned_int,char>
                     (pJVar1,(char (*) [10])"codeAlign",&local_18->object->codeAlign,local_40 + 2);
  local_40[1] = 0;
  pJVar1 = JObject::field<char[10],int,char>
                     (pJVar1,(char (*) [10])"dataAlign",&local_18->object->dataAlign,local_40 + 1);
  local_40[0] = '\0';
  pJVar1 = JObject::field<char[19],int,char>
                     (pJVar1,(char (*) [19])"return address reg",&local_18->object->rar,local_40);
  local_48 = local_18->object->end - local_18->object->initial_instructions;
  local_49 = '\0';
  pJVar1 = JObject::field<char[19],unsigned_long,char>
                     (pJVar1,(char (*) [19])"instruction length",&local_48,&local_49);
  local_50 = (uint)local_18->object->lsdaEncoding;
  local_51 = '\0';
  pJVar1 = JObject::field<char[14],int,char>
                     (pJVar1,(char (*) [14])"LSDA encoding",(int *)&local_50,&local_51);
  DumpCFAInsns::DumpCFAInsns(&local_68,local_18->object->initial_instructions,local_18->object->end)
  ;
  pJVar1 = JObject::field<char[13],pstack::DumpCFAInsns,pstack::Dwarf::CFI_const*>
                     (pJVar1,(char (*) [13])"instructions",&local_68,local_18->context);
  poVar2 = JObject::operator_cast_to_ostream_(pJVar1);
  JObject::~JObject(&local_28);
  return poVar2;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<Dwarf::CIE, const Dwarf::CFI *> &dcie)
{
    return JObject(os)
    .field("version", int(dcie.object.version))
    .field("augmentation", dcie.object.augmentation)
    .field("codeAlign", dcie.object.codeAlign)
    .field("dataAlign", dcie.object.dataAlign)
    .field("return address reg", dcie.object.rar)
    .field("instruction length", dcie.object.end - dcie.object.initial_instructions)
    .field("LSDA encoding", int(dcie.object.lsdaEncoding))
    .field("instructions", DumpCFAInsns(dcie.object.initial_instructions, dcie.object.end), dcie.context);
}